

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::DeviceContextVkImpl::CommitViewports(DeviceContextVkImpl *this)

{
  float fVar1;
  float fVar2;
  uint32_t uVar3;
  ulong uVar4;
  char *Args_1;
  string msg;
  VkViewport VkViewports [16];
  string local_1b8;
  VkViewport local_198 [16];
  
  uVar4 = (ulong)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                 super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumViewports;
  if (uVar4 != 0) {
    Args_1 = (char *)0x0;
    do {
      *(undefined4 *)(*(char (*) [32])Args_1 + (long)&local_198[0].x) =
           *(undefined4 *)
            (*(char (*) [32])Args_1 +
            (long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                   super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports[0].TopLeftX);
      fVar1 = *(float *)((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>)
                                .super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports
                                [0].TopLeftY + (long)Args_1);
      *(float *)((long)VkViewports + (long)*(char (*) [32])((long)Args_1 + -0x1a0) + -0x14) = fVar1;
      *(undefined4 *)((long)VkViewports + (long)*(char (*) [32])((long)Args_1 + -0x1a0) + -0x10) =
           *(undefined4 *)
            ((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports[0].Width +
            (long)Args_1);
      fVar2 = *(float *)((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>)
                                .super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports
                                [0].Height + (long)Args_1);
      *(float *)((long)VkViewports + (long)*(char (*) [32])((long)Args_1 + -0x1a0) + -0xc) = fVar2;
      *(undefined4 *)((long)VkViewports + (long)*(char (*) [32])((long)Args_1 + -0x1a0) + -8) =
           *(undefined4 *)
            ((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports[0].MinDepth +
            (long)Args_1);
      *(undefined4 *)((long)VkViewports + (long)*(char (*) [32])((long)Args_1 + -0x1a0) + -4) =
           *(undefined4 *)
            ((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports[0].MaxDepth +
            (long)Args_1);
      *(float *)((long)VkViewports + (long)*(char (*) [32])((long)Args_1 + -0x1a0) + -0x14) =
           fVar1 + fVar2;
      *(float *)((long)VkViewports + (long)*(char (*) [32])((long)Args_1 + -0x1a0) + -0xc) = -fVar2;
      Args_1 = *(char (*) [32])Args_1 + 0x18;
    } while ((char *)(uVar4 * 0x18) != Args_1);
    EnsureVkCmdBuffer(this);
    uVar3 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumViewports;
    if ((this->m_CommandBuffer).m_VkCmdBuffer == (VkCommandBuffer)0x0) {
      FormatString<char[26],char[32]>
                (&local_1b8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])Args_1);
      DebugAssertionFailed
                (local_1b8._M_dataplus._M_p,"SetViewports",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
                 ,0x1b7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
    }
    (*vkCmdSetViewport)((this->m_CommandBuffer).m_VkCmdBuffer,0,uVar3,local_198);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::CommitViewports()
{
    if (m_NumViewports == 0)
        return;

    VkViewport VkViewports[MAX_VIEWPORTS]; // Do not waste time initializing array to zero
    for (Uint32 vp = 0; vp < m_NumViewports; ++vp)
    {
        VkViewports[vp].x        = m_Viewports[vp].TopLeftX;
        VkViewports[vp].y        = m_Viewports[vp].TopLeftY;
        VkViewports[vp].width    = m_Viewports[vp].Width;
        VkViewports[vp].height   = m_Viewports[vp].Height;
        VkViewports[vp].minDepth = m_Viewports[vp].MinDepth;
        VkViewports[vp].maxDepth = m_Viewports[vp].MaxDepth;

        // Turn the viewport upside down to be consistent with Direct3D. Note that in both APIs,
        // the viewport covers the same texture rows. The difference is that Direct3D inverts
        // normalized device Y coordinate when transforming NDC to window coordinates. In Vulkan
        // we achieve the same effect by using negative viewport height. Therefore we need to
        // invert normalized device Y coordinate when transforming to texture V
        //
        //
        //       Image                Direct3D                                       Image               Vulkan
        //        row                                                                 row
        //         0 _   (0,0)_______________________(1,0)                  Tex Height _   (0,1)_______________________(1,1)
        //         1 _       |                       |      |             VP Top + Hght _ _ _ _|   __________          |      A
        //         2 _       |                       |      |                          .       |  |   .--> +x|         |      |
        //           .       |                       |      |                          .       |  |   |      |         |      |
        //           .       |                       |      | V Coord                          |  |   V +y   |         |      | V Coord
        //     VP Top _ _ _ _|   __________          |      |                    VP Top _ _ _ _|  |__________|         |      |
        //           .       |  |    A +y  |         |      |                          .       |                       |      |
        //           .       |  |    |     |         |      |                          .       |                       |      |
        //           .       |  |    '-->+x|         |      |                        2 _       |                       |      |
        //           .       |  |__________|         |      |                        1 _       |                       |      |
        //Tex Height _       |_______________________|      V                        0 _       |_______________________|      |
        //               (0,1)                       (1,1)                                 (0,0)                       (1,0)
        //
        //

        VkViewports[vp].y      = VkViewports[vp].y + VkViewports[vp].height;
        VkViewports[vp].height = -VkViewports[vp].height;
    }
    EnsureVkCmdBuffer();
    // TODO: reinterpret_cast m_Viewports to VkViewports?
    m_CommandBuffer.SetViewports(0, m_NumViewports, VkViewports);
}